

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O3

void __thiscall BoundaryElement::downward_pass(BoundaryElement *this,double *potential)

{
  double *pdVar1;
  double dVar2;
  Timers_BoundaryElement *pTVar3;
  Elements *pEVar4;
  InterpolationPoints *pIVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  pointer pdVar9;
  uint uVar10;
  rep rVar11;
  unsigned_long uVar12;
  ulong uVar13;
  uint uVar14;
  pointer pdVar16;
  long lVar17;
  int k2;
  ulong uVar18;
  long lVar19;
  pointer pdVar20;
  size_t node_idx;
  Tree *this_00;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  pointer pdVar25;
  pointer pdVar26;
  pointer pdVar27;
  pointer pdVar28;
  pointer pdVar29;
  int iVar31;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  double dVar33;
  double dVar34;
  double dVar35;
  double dist_y;
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar43;
  double dVar44;
  array<unsigned_long,_2UL> aVar45;
  vector<double,_std::allocator<double>_> weights;
  allocator_type local_159;
  BoundaryElement *local_158;
  int local_14c;
  pointer local_148;
  pointer local_140;
  size_t local_138;
  ulong local_130;
  pointer local_128;
  long local_120;
  long local_118;
  long local_110;
  size_t local_108;
  pointer local_100;
  pointer local_f8;
  pointer local_f0;
  pointer local_e8;
  pointer local_e0;
  pointer local_d8;
  pointer local_d0;
  double *local_c8;
  long local_c0;
  unsigned_long local_b8;
  pointer local_b0;
  pointer local_a8;
  ulong local_a0;
  long local_98;
  pointer local_90;
  pointer local_88;
  pointer local_80;
  pointer local_78;
  long local_70;
  ulong local_68;
  pointer local_60;
  pointer local_58;
  ulong local_50;
  vector<double,_std::allocator<double>_> local_48;
  ulong uVar15;
  
  pTVar3 = this->timers_;
  local_c8 = potential;
  rVar11 = std::chrono::_V2::steady_clock::now();
  (pTVar3->downward_pass).start_time_.__d.__r = rVar11;
  pEVar4 = this->elements_;
  pIVar5 = this->interp_pts_;
  local_140 = (pIVar5->interp_x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_148 = (pIVar5->interp_y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  pdVar29 = (pIVar5->interp_z_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_78 = (this->interp_potential_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_80 = (this->interp_potential_dx_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_88 = (this->interp_potential_dy_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_90 = (this->interp_potential_dz_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_d0 = (pEVar4->super_Particles).x_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_d8 = (pEVar4->super_Particles).y_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_e0 = (pEVar4->super_Particles).z_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_e8 = (pEVar4->target_charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_f0 = (pEVar4->target_charge_dx_).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start;
  local_f8 = (pEVar4->target_charge_dy_).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start;
  local_100 = (pEVar4->target_charge_dz_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_158 = this;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_48,(long)pIVar5->num_interp_pts_per_node_,&local_159);
  pdVar9 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar8 = _DAT_0011a8d0;
  auVar7 = _DAT_0011a8c0;
  auVar40 = _DAT_0011a8b0;
  auVar39 = _DAT_0011a2b0;
  auVar38 = _DAT_0011a2a0;
  uVar10 = (uint)((ulong)((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_finish -
                         (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar10) {
    lVar17 = (ulong)(uVar10 & 0x7fffffff) - 1;
    auVar30._8_4_ = (int)lVar17;
    auVar30._0_8_ = lVar17;
    auVar30._12_4_ = (int)((ulong)lVar17 >> 0x20);
    uVar18 = 0;
    auVar30 = auVar30 ^ _DAT_0011a2a0;
    auVar32 = _DAT_0011a290;
    do {
      bVar6 = auVar30._0_4_ < SUB164(auVar32 ^ auVar38,0);
      iVar31 = auVar30._4_4_;
      iVar43 = SUB164(auVar32 ^ auVar38,4);
      auVar41._4_4_ = auVar32._0_4_;
      auVar41._0_4_ = auVar32._4_4_;
      auVar41._8_4_ = auVar32._12_4_;
      auVar41._12_4_ = auVar32._8_4_;
      auVar41 = auVar41 & auVar40;
      auVar42._0_4_ = -(uint)(auVar41._0_4_ == 0);
      auVar42._4_4_ = -(uint)(auVar41._4_4_ == 0);
      auVar42._8_4_ = -(uint)(auVar41._8_4_ == 0);
      auVar42._12_4_ = -(uint)(auVar41._12_4_ == 0);
      auVar41 = auVar42 & auVar8 | ~auVar42 & auVar7;
      dVar34 = auVar41._0_8_;
      dVar35 = auVar41._8_8_;
      if ((bool)(~(iVar31 < iVar43 || iVar43 == iVar31 && bVar6) & 1)) {
        dVar44 = dVar34 * 0.5;
        dVar33 = dVar44;
        if (uVar10 - 1 != uVar18) {
          dVar33 = dVar34;
        }
        if (uVar18 != 0) {
          dVar44 = dVar33;
        }
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar18] = dVar44;
      }
      if (iVar31 >= iVar43 && (iVar43 != iVar31 || !bVar6)) {
        dVar34 = dVar35 * 0.5;
        if ((ulong)(uVar10 - 1) - 1 != uVar18) {
          dVar34 = dVar35;
        }
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar18 + 1] = dVar34;
      }
      uVar18 = uVar18 + 2;
      lVar17 = auVar32._8_8_;
      auVar32._0_8_ = auVar32._0_8_ + auVar39._0_8_;
      auVar32._8_8_ = lVar17 + auVar39._8_8_;
    } while ((uVar10 + 1 & 0xfffffffe) != uVar18);
  }
  this_00 = local_158->tree_;
  if (this_00->num_nodes_ != 0) {
    local_108 = (local_158->elements_->super_Particles).num_;
    uVar10 = local_158->interp_pts_->num_interp_pts_per_node_;
    uVar18 = (ulong)uVar10;
    local_118 = (long)(int)uVar10;
    local_14c = uVar10 * uVar10;
    local_110 = local_118 * 8;
    local_120 = uVar18 * 8;
    node_idx = 0;
    pdVar26 = local_140;
    pdVar27 = local_148;
    local_130 = uVar18;
    do {
      local_138 = node_idx;
      aVar45 = Tree::node_particle_idxs(this_00,node_idx);
      uVar12 = aVar45._M_elems[0];
      lVar17 = aVar45._M_elems[1] - uVar12;
      if (lVar17 != 0) {
        local_60 = local_148 + local_138 * local_118;
        local_58 = local_140 + local_138 * local_118;
        local_70 = (long)local_158->num_charges_per_node_ * local_138;
        lVar19 = 0;
        do {
          local_98 = lVar19;
          local_a0 = local_98 + uVar12;
          if ((int)uVar18 < 1) {
            dVar34 = 0.0;
            dVar35 = 0.0;
            dVar44 = 0.0;
            uVar14 = 0xffffffff;
            uVar10 = 0xffffffff;
            uVar22 = 0xffffffff;
          }
          else {
            dVar34 = 0.0;
            dVar35 = 0.0;
            uVar23 = 0xffffffff;
            dVar44 = 0.0;
            uVar13 = 0;
            uVar21 = 0xffffffff;
            uVar24 = 0xffffffff;
            uVar15 = local_a0;
            do {
              dVar36 = local_d0[local_a0] - pdVar26[uVar13];
              dVar33 = pdVar9[uVar13];
              dVar44 = dVar44 + dVar33 / dVar36;
              auVar39._0_8_ = local_e0[local_a0] - pdVar29[uVar13];
              auVar39._8_8_ = local_d8[local_a0] - pdVar27[uVar13];
              auVar38._8_8_ = dVar33;
              auVar38._0_8_ = dVar33;
              auVar38 = divpd(auVar38,auVar39);
              if ((double)((ulong)dVar36 & (ulong)DAT_0011a8e0) < 2.2250738585072014e-308) {
                uVar23 = uVar13 & 0xffffffff;
              }
              uVar22 = (uint)uVar23;
              dVar34 = dVar34 + auVar38._0_8_;
              dVar35 = dVar35 + auVar38._8_8_;
              auVar40._8_8_ =
                   -(ulong)((double)((ulong)auVar39._8_8_ & DAT_0011a8e0._8_8_) < DAT_0011a930._8_8_
                           );
              auVar40._0_8_ =
                   -(ulong)((double)((ulong)auVar39._0_8_ & (ulong)DAT_0011a8e0) <
                           (double)DAT_0011a930);
              uVar14 = movmskpd((int)uVar15,auVar40);
              uVar15 = (ulong)uVar14;
              if ((uVar14 & 2) != 0) {
                uVar21 = uVar13 & 0xffffffff;
              }
              uVar10 = (uint)uVar21;
              if ((uVar14 & 1) != 0) {
                uVar24 = uVar13 & 0xffffffff;
              }
              uVar14 = (uint)uVar24;
              uVar13 = uVar13 + 1;
            } while (uVar18 != uVar13);
          }
          dVar33 = 1.0;
          if (uVar22 == 0xffffffff) {
            dVar33 = 1.0 / dVar44;
          }
          if (uVar10 == 0xffffffff) {
            dVar33 = dVar33 / dVar35;
          }
          if (uVar14 == 0xffffffff) {
            dVar33 = dVar33 / dVar34;
          }
          if ((int)uVar18 < 1) {
            dVar34 = 0.0;
            dVar35 = 0.0;
            dVar44 = 0.0;
            dVar36 = 0.0;
          }
          else {
            local_50 = (ulong)uVar10;
            dVar34 = 0.0;
            dVar35 = 0.0;
            uVar13 = 0;
            dVar44 = 0.0;
            dVar36 = 0.0;
            uVar15 = 0;
            do {
              local_68 = uVar15;
              lVar19 = (int)local_68 + local_70;
              pdVar16 = local_78 + lVar19;
              pdVar28 = local_80 + lVar19;
              pdVar25 = local_88 + lVar19;
              pdVar20 = local_90 + lVar19;
              uVar18 = 0;
              do {
                lVar19 = 0;
                do {
                  if (uVar22 == 0xffffffff) {
                    dVar37 = pdVar9[uVar13] / (local_d0[local_a0] - local_58[uVar13]);
                  }
                  else {
                    dVar37 = 1.0;
                    if (uVar13 != uVar22) {
                      dVar37 = 0.0;
                    }
                  }
                  if (uVar10 == 0xffffffff) {
                    dVar37 = dVar37 * (pdVar9[uVar18] / (local_d8[local_a0] - local_60[uVar18]));
                  }
                  else if (uVar18 != local_50) {
                    dVar37 = dVar37 * 0.0;
                  }
                  if (uVar14 == 0xffffffff) {
                    dVar37 = dVar37 * (*(double *)((long)pdVar9 + lVar19) /
                                      (local_e0[local_a0] - *(double *)((long)pdVar29 + lVar19)));
                  }
                  else if ((ulong)uVar14 << 3 != lVar19) {
                    dVar37 = dVar37 * 0.0;
                  }
                  dVar37 = dVar37 * dVar33;
                  dVar44 = dVar44 + *(double *)((long)pdVar25 + lVar19) * dVar37;
                  dVar36 = dVar36 + *(double *)((long)pdVar20 + lVar19) * dVar37;
                  dVar34 = dVar34 + *(double *)((long)pdVar16 + lVar19) * dVar37;
                  dVar35 = dVar35 + *(double *)((long)pdVar28 + lVar19) * dVar37;
                  lVar19 = lVar19 + 8;
                } while (local_120 != lVar19);
                uVar18 = uVar18 + 1;
                pdVar16 = (pointer)((long)pdVar16 + local_120);
                pdVar28 = (pointer)((long)pdVar28 + local_120);
                pdVar25 = (pointer)((long)pdVar25 + local_120);
                pdVar20 = (pointer)((long)pdVar20 + local_120);
              } while (uVar18 != local_130);
              uVar13 = uVar13 + 1;
              uVar15 = (ulong)(uint)((int)local_68 + local_14c);
              uVar18 = local_130;
            } while (uVar13 != local_130);
          }
          dVar33 = local_f8[local_a0];
          dVar37 = local_f0[local_a0];
          dVar2 = local_100[local_a0];
          pdVar1 = local_c8 + local_a0;
          *pdVar1 = local_e8[local_a0] * dVar34 + *pdVar1;
          pdVar1[local_108] = dVar36 * dVar2 + dVar35 * dVar37 + dVar33 * dVar44 + pdVar1[local_108]
          ;
          lVar19 = local_98 + 1;
          local_128 = pdVar29;
          local_c0 = lVar17;
          local_b8 = uVar12;
          local_b0 = pdVar27;
          local_a8 = pdVar26;
        } while (local_98 + 1 != lVar17);
      }
      node_idx = local_138 + 1;
      this_00 = local_158->tree_;
      pdVar29 = (pointer)((long)pdVar29 + local_110);
      pdVar27 = (pointer)((long)pdVar27 + local_110);
      pdVar26 = (pointer)((long)pdVar26 + local_110);
    } while (node_idx < this_00->num_nodes_);
  }
  pTVar3 = local_158->timers_;
  lVar17 = std::chrono::_V2::steady_clock::now();
  (pTVar3->downward_pass).end_time_.__d.__r = lVar17;
  (pTVar3->downward_pass).elapsed_time_.__r =
       (double)(lVar17 - (pTVar3->downward_pass).start_time_.__d.__r) / 1000000.0 +
       (pTVar3->downward_pass).elapsed_time_.__r;
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BoundaryElement::downward_pass(double* __restrict potential)
{
    timers_.downward_pass.start();

    const double* __restrict clusters_x_ptr    = interp_pts_.interp_x_ptr();
    const double* __restrict clusters_y_ptr    = interp_pts_.interp_y_ptr();
    const double* __restrict clusters_z_ptr    = interp_pts_.interp_z_ptr();
    
    const double* __restrict clusters_p_ptr    = interp_potential_.data();
    const double* __restrict clusters_p_dx_ptr = interp_potential_dx_.data();
    const double* __restrict clusters_p_dy_ptr = interp_potential_dy_.data();
    const double* __restrict clusters_p_dz_ptr = interp_potential_dz_.data();
    
    const double* __restrict elements_x_ptr   = elements_.x_ptr();
    const double* __restrict elements_y_ptr   = elements_.y_ptr();
    const double* __restrict elements_z_ptr   = elements_.z_ptr();
    
    const double* __restrict targets_q_ptr     = elements_.target_charge_ptr();
    const double* __restrict targets_q_dx_ptr  = elements_.target_charge_dx_ptr();
    const double* __restrict targets_q_dy_ptr  = elements_.target_charge_dy_ptr();
    const double* __restrict targets_q_dz_ptr  = elements_.target_charge_dz_ptr();
    
    std::vector<double> weights (interp_pts_.num_interp_pts_per_node());
    double* weights_ptr = weights.data();
    int weights_num = weights.size();
    
    for (int i = 0; i < weights_num; ++i) {
        weights[i] = ((i % 2 == 0)? 1 : -1);
        if (i == 0 || i == weights_num-1) weights[i] = ((i % 2 == 0)? 1 : -1) * 0.5;
    }
    
    std::size_t potential_offset = elements_.num();
    int num_interp_pts_per_node = interp_pts_.num_interp_pts_per_node();
    
#ifdef OPENACC_ENABLED
#pragma acc enter data copyin(weights_ptr[0:weights_num])
#endif
    
    for (std::size_t node_idx = 0; node_idx < tree_.num_nodes(); ++node_idx) {
        
        auto particle_idxs = tree_.node_particle_idxs(node_idx);
        std::size_t node_interp_pts_start = node_idx * num_interp_pts_per_node;
        std::size_t node_potentials_start = node_idx * num_charges_per_node_;
        
        std::size_t particle_start = particle_idxs[0];
        std::size_t num_particles  = particle_idxs[1] - particle_idxs[0];

#ifdef OPENACC_ENABLED
        int stream_id = std::rand() % 3;
#pragma acc parallel loop async(stream_id) present(elements_x_ptr, elements_y_ptr, elements_z_ptr, \
                                  targets_q_ptr, targets_q_dx_ptr, targets_q_dy_ptr, targets_q_dz_ptr, \
                                  clusters_x_ptr, clusters_y_ptr, clusters_z_ptr, \
                                  clusters_p_ptr, clusters_p_dx_ptr, clusters_p_dy_ptr, clusters_p_dz_ptr, \
                                  potential, weights_ptr)
#endif
        for (std::size_t i = 0; i < num_particles; ++i) {
        
            double denominator_x = 0.;
            double denominator_y = 0.;
            double denominator_z = 0.;
            
            int exact_idx_x = -1;
            int exact_idx_y = -1;
            int exact_idx_z = -1;
            
            double xx = elements_x_ptr[particle_start + i];
            double yy = elements_y_ptr[particle_start + i];
            double zz = elements_z_ptr[particle_start + i];
            
#ifdef OPENACC_ENABLED
            #pragma acc loop reduction(+:denominator_x,denominator_y,denominator_z) \
                             reduction(max:exact_idx_x,exact_idx_y,exact_idx_z)
#endif
            for (int j = 0; j < num_interp_pts_per_node; ++j) {
            
                double dist_x = xx - clusters_x_ptr[node_interp_pts_start + j];
                double dist_y = yy - clusters_y_ptr[node_interp_pts_start + j];
                double dist_z = zz - clusters_z_ptr[node_interp_pts_start + j];
                
                denominator_x += weights_ptr[j] / dist_x;
                denominator_y += weights_ptr[j] / dist_y;
                denominator_z += weights_ptr[j] / dist_z;
                
                if (std::abs(dist_x) < std::numeric_limits<double>::min()) exact_idx_x = j;
                if (std::abs(dist_y) < std::numeric_limits<double>::min()) exact_idx_y = j;
                if (std::abs(dist_z) < std::numeric_limits<double>::min()) exact_idx_z = j;
            }
            
            double denominator = 1.;
            if (exact_idx_x == -1) denominator /= denominator_x;
            if (exact_idx_y == -1) denominator /= denominator_y;
            if (exact_idx_z == -1) denominator /= denominator_z;

            double pot_comp_   = 0.;
            double pot_comp_dx = 0.;
            double pot_comp_dy = 0.;
            double pot_comp_dz = 0.;
            
#ifdef OPENACC_ENABLED
            #pragma acc loop collapse(3) reduction(+:pot_comp_,  pot_comp_dx, \
                                                     pot_comp_dy,pot_comp_dz)
#endif
            for (int k1 = 0; k1 < num_interp_pts_per_node; ++k1) {
            for (int k2 = 0; k2 < num_interp_pts_per_node; ++k2) {
            for (int k3 = 0; k3 < num_interp_pts_per_node; ++k3) {
                    
                std::size_t kk = node_potentials_start
                               + k1 * num_interp_pts_per_node * num_interp_pts_per_node
                               + k2 * num_interp_pts_per_node + k3;
                               
                double dist_x = xx - clusters_x_ptr[node_interp_pts_start + k1];
                double dist_y = yy - clusters_y_ptr[node_interp_pts_start + k2];
                double dist_z = zz - clusters_z_ptr[node_interp_pts_start + k3];
                
                double numerator = 1.;

                // If exact_idx == -1, then no issues.
                // If exact_idx != -1, then we want to zero out terms EXCEPT when exactInd=k1.
                if (exact_idx_x == -1) {
                    numerator *= weights_ptr[k1] / dist_x;
                } else {
                    if (exact_idx_x != k1) numerator *= 0.;
                }

                if (exact_idx_y == -1) {
                    numerator *= weights_ptr[k2] / dist_y;
                } else {
                    if (exact_idx_y != k2) numerator *= 0.;
                }

                if (exact_idx_z == -1) {
                    numerator *= weights_ptr[k3] / dist_z;
                } else {
                    if (exact_idx_z != k3) numerator *= 0.;
                }

                pot_comp_   += numerator * denominator * clusters_p_ptr   [kk];
                pot_comp_dx += numerator * denominator * clusters_p_dx_ptr[kk];
                pot_comp_dy += numerator * denominator * clusters_p_dy_ptr[kk];
                pot_comp_dz += numerator * denominator * clusters_p_dz_ptr[kk];
            }
            }
            }
            
            double pot_temp_1 = targets_q_ptr   [particle_start + i] * pot_comp_;
            double pot_temp_2 = targets_q_dx_ptr[particle_start + i] * pot_comp_dx
                              + targets_q_dy_ptr[particle_start + i] * pot_comp_dy
                              + targets_q_dz_ptr[particle_start + i] * pot_comp_dz;
#ifdef OPENACC_ENABLED
            #pragma acc atomic update
#endif
            potential[particle_start + i]                    += pot_temp_1;
#ifdef OPENACC_ENABLED
            #pragma acc atomic update
#endif
            potential[particle_start + i + potential_offset] += pot_temp_2;
        }
    } //end loop over nodes
#ifdef OPENACC_ENABLED
    #pragma acc wait
    #pragma acc exit data delete(weights_ptr[0:weights_num])
#endif

    timers_.downward_pass.stop();
}